

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int main(void)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  size_t out_len;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint8_t a [5];
  hydro_hash_state st;
  uint8_t b [5];
  uint8_t y [100];
  uint8_t x [100];
  uint8_t dk_1 [32];
  uint8_t subkey3 [32];
  uint8_t subkey1 [16];
  uint8_t server_peer_pk [32];
  uint8_t client_peer_pk [32];
  uint8_t subkey2 [16];
  char hex [201];
  hydro_kx_keypair local_2a58;
  hydro_kx_state *local_2a18 [4];
  uint8_t local_29f8 [32];
  uint8_t local_29d8 [64];
  hydro_kx_keypair local_2998;
  undefined1 local_2928 [64];
  undefined1 auStack_28e8 [35];
  char local_28c5;
  hydro_kx_session_keypair local_2858;
  hydro_kx_session_keypair local_2818;
  uint8_t local_27d8 [48];
  uint8_t local_27a8 [32];
  uint8_t local_2788 [32];
  uint8_t local_2768 [32];
  hydro_kx_state local_2748;
  undefined1 local_26a2 [9842];
  
  iVar4 = hydro_init();
  if (iVar4 != 0) {
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1de,"int main(void)");
  }
  auVar11 = vpbroadcastb_avx512bw(ZEXT116(0xd0));
  local_2a58.pk._0_5_ = 0x500000000;
  local_2a58.pk._0_4_ = 0x4030201;
  builtin_memcpy(local_29d8,"\x01\x02\x03\x04\x05",5);
  auVar12 = vmovdqu64_avx512f(auVar11);
  local_2928[0] = auVar12[0];
  local_2928[1] = auVar12[1];
  local_2928._2_6_ = auVar12._2_6_;
  local_2928._8_8_ = auVar12._8_8_;
  local_2928._16_8_ = auVar12._16_8_;
  local_2928._24_8_ = auVar12._24_8_;
  local_2928._32_4_ = auVar12._32_4_;
  auVar12 = vmovdqu64_avx512f(auVar11);
  local_2928._36_28_ = auVar12._0_28_;
  auStack_28e8 = auVar12._28_35_;
  local_28c5 = auVar12[0x3f];
  hydro_memzero(local_2928,100);
  if (local_2928[0] != '\0') {
    __assert_fail("x[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x90,"void test_core(void)");
  }
  if (local_28c5 != '\0') {
    __assert_fail("x[sizeof x - 1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x91,"void test_core(void)");
  }
  hydro_increment(local_2928,100);
  if (local_2928[0] != '\x01') {
    __assert_fail("x[0] == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x93,"void test_core(void)");
  }
  if (local_28c5 != '\0') {
    __assert_fail("x[sizeof x - 1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x94,"void test_core(void)");
  }
  local_2928[0] = 0xff;
  hydro_increment(local_2928,100);
  if (local_2928[0] != '\0') {
    __assert_fail("x[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x97,"void test_core(void)");
  }
  if (local_2928[1] != '\x01') {
    __assert_fail("x[1] == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x98,"void test_core(void)");
  }
  if (local_28c5 != '\0') {
    __assert_fail("x[sizeof x - 1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x99,"void test_core(void)");
  }
  _Var3 = hydro_equal(&local_2a58,local_29d8,5);
  if (!_Var3) {
    __assert_fail("hydro_equal(a, b, sizeof a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9a,"void test_core(void)");
  }
  _Var3 = hydro_equal(&local_2a58,&local_2a58,5);
  if (_Var3) {
    __assert_fail("!hydro_equal(a, a, sizeof a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9b,"void test_core(void)");
  }
  iVar4 = hydro_compare(local_2a58.pk,local_29d8,5);
  if (iVar4 != 0) {
    __assert_fail("hydro_compare(a, b, sizeof a) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9c,"void test_core(void)");
  }
  iVar4 = hydro_compare(local_2a58.pk,local_2a58.pk,5);
  if (iVar4 != 0) {
    __assert_fail("hydro_compare(a, a, sizeof a) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9d,"void test_core(void)");
  }
  local_2a58.pk[0] = local_2a58.pk[0] + '\x01';
  iVar4 = hydro_compare(local_2a58.pk,local_29d8,5);
  if (iVar4 != 1) {
    __assert_fail("hydro_compare(a, b, sizeof a) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x9f,"void test_core(void)");
  }
  iVar4 = hydro_compare(local_29d8,local_2a58.pk,5);
  if (iVar4 != -1) {
    __assert_fail("hydro_compare(b, a, sizeof a) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa0,"void test_core(void)");
  }
  hydro_random_buf(local_2928,100);
  pcVar6 = hydro_bin2hex((char *)&local_2748,0xc9,local_2928,100);
  if (pcVar6 == (char *)0x0) {
    __assert_fail("hydro_bin2hex(hex, sizeof hex, x, sizeof x) != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa2,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(local_2998.pk,1,(char *)&local_2748,0xc9,(char *)0x0,(char **)0x0);
  if (iVar4 != -1) {
    __assert_fail("hydro_hex2bin(y, 1, hex, sizeof hex, NULL, NULL) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa3,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(local_2998.pk,100,(char *)&local_2748,0xc9,(char *)0x0,(char **)0x0);
  if (iVar4 != -1) {
    __assert_fail("hydro_hex2bin(y, sizeof y, hex, sizeof hex, NULL, NULL) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa4,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(local_2998.pk,100,(char *)&local_2748,200,(char *)0x0,(char **)0x0);
  if (iVar4 != 100) {
    __assert_fail("hydro_hex2bin(y, sizeof y, hex, sizeof hex - 1, NULL, NULL) == sizeof x",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa5,"void test_core(void)");
  }
  _Var3 = hydro_equal(local_2928,&local_2998,100);
  if (!_Var3) {
    __assert_fail("hydro_equal(x, y, sizeof x)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa6,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(local_2928,100,"452a",4,(char *)0x0,(char **)0x0);
  if (iVar4 != 2) {
    __assert_fail("hydro_hex2bin(x, sizeof x, \"452a\", 4, NULL, NULL) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa7,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(local_2998.pk,100,"#452a#",6,"#",(char **)0x0);
  if (iVar4 != 2) {
    __assert_fail("hydro_hex2bin(y, sizeof y, \"#452a#\", 6, \"#\", NULL) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa8,"void test_core(void)");
  }
  _Var3 = hydro_equal(local_2928,&local_2998,100);
  if (!_Var3) {
    __assert_fail("hydro_equal(x, y, sizeof x)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xa9,"void test_core(void)");
  }
  builtin_memcpy(local_2748.eph_kp.pk,"#452a",6);
  iVar4 = hydro_hex2bin(local_2928,100,(char *)&local_2748,0,(char *)0x0,(char **)local_2a18);
  if (iVar4 != 0) {
    __assert_fail("hydro_hex2bin(x, sizeof x, hex, 0, NULL, &hexf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xab,"void test_core(void)");
  }
  if (local_2a18[0] != &local_2748) {
    __assert_fail("hexf == hex",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xac,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(local_2928,100,(char *)&local_2748,6,(char *)0x0,(char **)local_2a18);
  if (iVar4 != 0) {
    __assert_fail("hydro_hex2bin(x, sizeof x, hex, sizeof \"#452a\", NULL, &hexf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xad,"void test_core(void)");
  }
  if (local_2a18[0] != &local_2748) {
    __assert_fail("hexf == hex",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xae,"void test_core(void)");
  }
  iVar4 = hydro_hex2bin(local_2928,100,(char *)&local_2748,6,"#",(char **)local_2a18);
  if (iVar4 != 2) {
    __assert_fail("hydro_hex2bin(x, sizeof x, hex, sizeof \"#452a\", \"#\", &hexf) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xaf,"void test_core(void)");
  }
  if (local_2a18[0] != (hydro_kx_state *)(local_2748.eph_kp.pk + 6)) {
    __assert_fail("hexf == hex + 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xb0,"void test_core(void)");
  }
  local_2a58.pk[0] = '\0';
  local_2a58.pk[1] = '\0';
  local_2a58.pk[2] = '\0';
  local_2a58.pk[3] = '\0';
  local_2a58.pk[4] = '\0';
  local_2a58.pk[5] = '\0';
  local_2a58.pk[6] = '\0';
  local_2a58.pk[7] = '\0';
  local_2a58.pk[8] = '\0';
  local_2a58.pk[9] = '\0';
  local_2a58.pk[10] = '\0';
  local_2a58.pk[0xb] = '\0';
  local_2a58.pk[0xc] = '\0';
  local_2a58.pk[0xd] = '\0';
  local_2a58.pk[0xe] = '\0';
  local_2a58.pk[0xf] = '\0';
  local_2a58.pk[0x10] = '\0';
  local_2a58.pk[0x11] = '\0';
  local_2a58.pk[0x12] = '\0';
  local_2a58.pk[0x13] = '\0';
  local_2a58.pk[0x14] = '\0';
  local_2a58.pk[0x15] = '\0';
  local_2a58.pk[0x16] = '\0';
  local_2a58.pk[0x17] = '\0';
  local_2a58.pk[0x18] = '\0';
  local_2a58.pk[0x19] = '\0';
  local_2a58.pk[0x1a] = '\0';
  local_2a58.pk[0x1b] = '\0';
  local_2a58.pk[0x1c] = '\0';
  local_2a58.pk[0x1d] = '\0';
  local_2a58.pk[0x1e] = '\0';
  local_2a58.pk[0x1f] = '\0';
  hydro_random_buf_deterministic(local_29d8,0x20,local_2a58.pk);
  hydro_increment(local_2a58.pk,0x20);
  hydro_hash_init((hydro_hash_state *)local_2a18,"libtests",local_29d8);
  out_len = 0;
  do {
    hydro_random_buf_deterministic(&local_2748,out_len,local_2a58.pk);
    hydro_increment(local_2a58.pk,0x20);
    hydro_hash_update((hydro_hash_state *)local_2a18,&local_2748,out_len);
    out_len = out_len + 1;
  } while (out_len != 0x3e9);
  hydro_hash_final((hydro_hash_state *)local_2a18,local_2998.pk,100);
  hydro_bin2hex(local_2928,0xc9,local_2998.pk,100);
  iVar4 = streq("e5d2beb77a039965850ee76327e06b2fa6cb5121db8038b11bce4641a9c4bd843658104bdf07342570bb5fd1d72c0d31a8981b47c718fddaffbd4171605c873cbaf921bb57988dd814f3a3fbef9799ff7c762705c4bf37ab29815981bf0d8833d60afe14"
                ,local_2928);
  if (iVar4 == 0) {
    __assert_fail("streq((\"e5d2beb77a039965850ee76327e06b2fa6cb5121db8038b11bce4641a9c4bd843658104bdf07342570bb5fd1d7\" \"2c0d31a8981b47c718fddaffbd4171605c873cbaf921bb57988dd814f3a3fbef9799ff7c762705c4bf37ab2981\" \"5981bf0d8833d60afe14\"), (hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x6c,"void test_hash(void)");
  }
  hydro_hash_hash(local_2998.pk,100,&local_2748,1000,"libtests",local_29d8);
  hydro_bin2hex(local_2928,0xc9,local_2998.pk,100);
  iVar4 = streq("724bd8883df73320ffd70923cb997f9a99bc670c4d78887be4975add0099fbf489b266a85d1f56743062d60a05590cbce47e45108367879bf4641cbaefe584e8618cbeb8c230ae956da22c7c5c4f11a8804ca576ec20fa5da239dde3d03a6018383c21f5"
                ,local_2928);
  if (iVar4 == 0) {
    __assert_fail("streq((\"724bd8883df73320ffd70923cb997f9a99bc670c4d78887be4975add0099fbf489b266a85d1f56743062d60a05\" \"590cbce47e45108367879bf4641cbaefe584e8618cbeb8c230ae956da22c7c5c4f11a8804ca576ec20fa5da239\" \"dde3d03a6018383c21f5\"), (hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x75,"void test_hash(void)");
  }
  hydro_hash_hash(local_2998.pk,0x20,&local_2748,1000,"libtests",local_29d8);
  hydro_bin2hex(local_2928,0xc9,local_2998.pk,0x20);
  iVar4 = streq("7dfa45ce18210e2422fd658bf7beccb6e534e44f99ae359f4af3ba41af8ca463",local_2928);
  if (iVar4 == 0) {
    __assert_fail("streq((\"7dfa45ce18210e2422fd658bf7beccb6e534e44f99ae359f4af3ba41af8ca463\"), (hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x7a,"void test_hash(void)");
  }
  hydro_hash_hash(local_2998.pk,0x20,&local_2748,0xd,"libtests",local_29d8);
  hydro_bin2hex(local_2928,0xc9,local_2998.pk,0x20);
  iVar4 = streq("d57a9800549bb4bab6a06fa6e16e08aad68d7d4313fb69a81b9f5d5af375dbe7",local_2928);
  if (iVar4 == 0) {
    __assert_fail("streq((\"d57a9800549bb4bab6a06fa6e16e08aad68d7d4313fb69a81b9f5d5af375dbe7\"), (hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x80,"void test_hash(void)");
  }
  local_2858.rx[0] = '\0';
  local_2858.rx[1] = '\0';
  local_2858.rx[2] = '\0';
  local_2858.rx[3] = '\0';
  local_2858.rx[4] = '\0';
  local_2858.rx[5] = '\0';
  local_2858.rx[6] = '\0';
  local_2858.rx[7] = '\0';
  local_2858.rx[8] = '\0';
  local_2858.rx[9] = '\0';
  local_2858.rx[10] = '\0';
  local_2858.rx[0xb] = '\0';
  local_2858.rx[0xc] = '\0';
  local_2858.rx[0xd] = '\0';
  local_2858.rx[0xe] = '\0';
  local_2858.rx[0xf] = '\0';
  local_2858.rx[0x10] = '\0';
  local_2858.rx[0x11] = '\0';
  local_2858.rx[0x12] = '\0';
  local_2858.rx[0x13] = '\0';
  local_2858.rx[0x14] = '\0';
  local_2858.rx[0x15] = '\0';
  local_2858.rx[0x16] = '\0';
  local_2858.rx[0x17] = '\0';
  local_2858.rx[0x18] = '\0';
  local_2858.rx[0x19] = '\0';
  local_2858.rx[0x1a] = '\0';
  local_2858.rx[0x1b] = '\0';
  local_2858.rx[0x1c] = '\0';
  local_2858.rx[0x1d] = '\0';
  local_2858.rx[0x1e] = '\0';
  local_2858.rx[0x1f] = '\0';
  hydro_random_buf_deterministic(local_29d8,0x20,local_2858.rx);
  hydro_kdf_derive_from_key(local_27d8,0x10,1,"libtests",local_29d8);
  hydro_kdf_derive_from_key(local_2768,0x10,2,"libtests",local_29d8);
  hydro_kdf_derive_from_key(local_2818.rx,0x20,0,"libtests",local_29d8);
  hydro_kdf_derive_from_key(local_2998.pk,0x32,0,"libtests",local_29d8);
  hydro_bin2hex((char *)local_2a18,0x21,local_27d8,0x10);
  hydro_bin2hex((char *)&local_2a58,0x21,local_2768,0x10);
  hydro_bin2hex(local_2928,0x41,local_2818.rx,0x20);
  hydro_bin2hex((char *)&local_2748,0x65,local_2998.pk,0x32);
  iVar4 = streq("af8019d3516d4ba6c80a7ea5a87e4d77",(char *)local_2a18);
  if (iVar4 == 0) {
    __assert_fail("streq((\"af8019d3516d4ba6c80a7ea5a87e4d77\"), (subkey1_hex))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xf3,"void test_kdf(void)");
  }
  iVar4 = streq("af8c4cba4e1f36c293631cc7001717dd",(char *)&local_2a58);
  if (iVar4 == 0) {
    __assert_fail("streq((\"af8c4cba4e1f36c293631cc7001717dd\"), (subkey2_hex))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xf4,"void test_kdf(void)");
  }
  iVar4 = streq("ff9345489dea1e4fe59194cea8794c9b0af9380c2d18c3ab38eeef2af95c1e26",local_2928);
  if (iVar4 == 0) {
    __assert_fail("streq((\"ff9345489dea1e4fe59194cea8794c9b0af9380c2d18c3ab38eeef2af95c1e26\"), (subkey3_hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xf5,"void test_kdf(void)");
  }
  iVar4 = streq("a8dd79ca19d604d1487b82d76b8d4ad4138a29dfaeeb207b99b2e5904e7855555bb94a76070fa71871df6ed911661d99efec"
                ,(char *)&local_2748);
  if (iVar4 == 0) {
    __assert_fail("streq((\"a8dd79ca19d604d1487b82d76b8d4ad4138a29dfaeeb207b99b2e5904e7855555bb94a76070fa71871df6ed911\" \"661d99efec\"), (subkey4_hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xf9,"void test_kdf(void)");
  }
  hydro_kx_keygen(&local_2748.eph_kp);
  hydro_random_buf(&local_2a58,0x20);
  hydro_kx_n_1((hydro_kx_session_keypair *)local_2928,(uint8_t *)local_2a18,local_2a58.pk,
               (uint8_t *)&local_2748);
  hydro_kx_n_2((hydro_kx_session_keypair *)&local_2998,(uint8_t *)local_2a18,local_2a58.pk,
               &local_2748.eph_kp);
  _Var3 = hydro_equal(local_2928 + 0x20,&local_2998,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x140,"void test_kx_n(void)");
  }
  _Var3 = hydro_equal(local_2928,local_2998.sk,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x141,"void test_kx_n(void)");
  }
  hydro_kx_keygen((hydro_kx_keypair *)local_2928);
  hydro_kx_keygen(&local_2998);
  hydro_kx_kk_1(&local_2748,local_29d8,local_2998.pk,(hydro_kx_keypair *)local_2928);
  hydro_kx_kk_2((hydro_kx_session_keypair *)&local_2a58,local_2858.rx,local_29d8,
                (uint8_t *)local_2928,&local_2998);
  hydro_kx_kk_3(&local_2748,(hydro_kx_session_keypair *)local_2a18,local_2858.rx,
                (hydro_kx_keypair *)local_2928);
  _Var3 = hydro_equal(((hydro_kx_keypair *)local_2a18)->sk,&local_2a58,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x156,"void test_kx_kk(void)");
  }
  _Var3 = hydro_equal((hydro_kx_keypair *)local_2a18,local_2a58.sk,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x157,"void test_kx_kk(void)");
  }
  hydro_kx_keygen((hydro_kx_keypair *)local_2a18);
  hydro_kx_keygen(&local_2a58);
  hydro_kx_xx_1(&local_2748,local_27d8,(uint8_t *)0x0);
  hydro_kx_xx_2((hydro_kx_state *)local_2928,local_2998.pk,local_27d8,(uint8_t *)0x0,&local_2a58);
  hydro_kx_xx_3(&local_2748,&local_2858,local_29d8,(uint8_t *)0x0,local_2998.pk,(uint8_t *)0x0,
                (hydro_kx_keypair *)local_2a18);
  hydro_kx_xx_4((hydro_kx_state *)local_2928,&local_2818,(uint8_t *)0x0,local_29d8,(uint8_t *)0x0);
  _Var3 = hydro_equal(local_2858.tx,&local_2818,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x172,"void test_kx_xx(void)");
  }
  _Var3 = hydro_equal(&local_2858,local_2818.tx,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x173,"void test_kx_xx(void)");
  }
  hydro_random_buf(local_2768,0x20);
  hydro_kx_xx_1(&local_2748,local_27d8,local_2768);
  hydro_kx_xx_2((hydro_kx_state *)local_2928,local_2998.pk,local_27d8,local_2768,&local_2a58);
  hydro_kx_xx_3(&local_2748,&local_2858,local_29d8,local_2788,local_2998.pk,local_2768,
                (hydro_kx_keypair *)local_2a18);
  hydro_kx_xx_4((hydro_kx_state *)local_2928,&local_2818,local_27a8,local_29d8,local_2768);
  _Var3 = hydro_equal(local_2858.tx,&local_2818,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17b,"void test_kx_xx(void)");
  }
  _Var3 = hydro_equal(&local_2858,local_2818.tx,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17c,"void test_kx_xx(void)");
  }
  _Var3 = hydro_equal(local_2788,&local_2a58,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(client_peer_pk, server_static_kp.pk, hydro_kx_PUBLICKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17d,"void test_kx_xx(void)");
  }
  _Var3 = hydro_equal(local_27a8,(hydro_kx_keypair *)local_2a18,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(server_peer_pk, client_static_kp.pk, hydro_kx_PUBLICKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17e,"void test_kx_xx(void)");
  }
  hydro_kx_keygen((hydro_kx_keypair *)local_2928);
  hydro_kx_nk_1(&local_2748,local_2a58.pk,(uint8_t *)0x0,(uint8_t *)local_2928);
  hydro_kx_nk_2((hydro_kx_session_keypair *)local_2a18,local_29d8,local_2a58.pk,(uint8_t *)0x0,
                (hydro_kx_keypair *)local_2928);
  hydro_kx_nk_3(&local_2748,(hydro_kx_session_keypair *)&local_2998,local_29d8);
  _Var3 = hydro_equal(local_2998.sk,(hydro_kx_keypair *)local_2a18,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x192,"void test_kx_nk(void)");
  }
  _Var3 = hydro_equal(&local_2998,((hydro_kx_keypair *)local_2a18)->sk,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x193,"void test_kx_nk(void)");
  }
  hydro_random_buf(&local_2858,0x20);
  hydro_kx_nk_1(&local_2748,local_2a58.pk,local_2858.rx,(uint8_t *)local_2928);
  hydro_kx_nk_2((hydro_kx_session_keypair *)local_2a18,local_29d8,local_2a58.pk,local_2858.rx,
                (hydro_kx_keypair *)local_2928);
  hydro_kx_nk_3(&local_2748,(hydro_kx_session_keypair *)&local_2998,local_29d8);
  _Var3 = hydro_equal(local_2998.sk,(hydro_kx_keypair *)local_2a18,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x19b,"void test_kx_nk(void)");
  }
  _Var3 = hydro_equal(&local_2998,((hydro_kx_keypair *)local_2a18)->sk,0x20);
  if (!_Var3) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x19c,"void test_kx_nk(void)");
  }
  builtin_memcpy(local_2a58.pk,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
  hydro_pwhash_deterministic(local_2998.pk,0x40,"test",4,"libtests",local_2a58.pk,1000,0,'\x01');
  hydro_bin2hex((char *)&local_2748,0x81,local_2998.pk,0x40);
  iVar4 = streq("2f1a804a02f25066fd0688bf8b8e03dff3a3866958a9cf5883c459e602e232d38e3e488723f0b4a2bc61d20cb36a04a4d2eb18be99bc61870d72d7de5d67f237"
                ,(char *)&local_2748);
  if (iVar4 == 0) {
    __assert_fail("streq((\"2f1a804a02f25066fd0688bf8b8e03dff3a3866958a9cf5883c459e602e232d38e3e488723f0b4a2bc61d2\" \"0cb36a04a4d2eb18be99bc61870d72d7de5d67f237\"), (h_hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b1,"void test_pwhash(void)");
  }
  hydro_pwhash_keygen(local_2a58.pk);
  iVar4 = hydro_pwhash_create(local_2928,"test",4,local_2a58.pk,1000,0,'\x01');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_create(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b5,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_2a58.pk,1000,0,'\x01');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b6,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_2a58.pk,2000,10,'\n');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops * 2, 10, 10) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b8,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_2a58.pk,500,10,'\n');
  if (iVar4 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops / 2, 10, 10) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1ba,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"Test",4,local_2a58.pk,1000,0,'\x01');
  if (iVar4 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"Test\", sizeof \"Test\" - 1, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1bb,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",3,local_2a58.pk,1000,0,'\x01');
  if (iVar4 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"tes\" - 1, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1bc,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_derive_static_key
                    ((uint8_t *)local_2a18,0x40,local_2928,"test",4,"libtests",local_2a58.pk,1000,0,
                     '\x01');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, \"test\", sizeof \"test\" - 1, ctx, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1bf,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_derive_static_key
                    ((uint8_t *)local_2a18,0x40,local_2928,"Test",4,"libtests",local_2a58.pk,1000,0,
                     '\x01');
  if (iVar4 != -1) {
    __assert_fail("hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, \"Test\", sizeof \"Test\" - 1, ctx, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c1,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_reencrypt(local_2928,local_2a58.pk,local_2a58.pk);
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_reencrypt(stored, master_key, master_key) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c3,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_2a58.pk,1000,0,'\x01');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c4,"void test_pwhash(void)");
  }
  hydro_pwhash_keygen(local_29d8);
  iVar4 = hydro_pwhash_reencrypt(local_2928,local_2a58.pk,local_29d8);
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_reencrypt(stored, master_key, new_master_key) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c6,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_2a58.pk,1000,0,'\x01');
  if (iVar4 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c7,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_29d8,1000,0,'\x01');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c8,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_upgrade(local_2928,local_29d8,2000,0,'\x01');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_upgrade(stored, new_master_key, ops * 2, 0, 1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1ca,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_29d8,1000,0,'\x01');
  if (iVar4 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1cb,"void test_pwhash(void)");
  }
  iVar4 = hydro_pwhash_verify(local_2928,"test",4,local_29d8,2000,0,'\x01');
  if (iVar4 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops * 2, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1cd,"void test_pwhash(void)");
  }
  lVar7 = 10000;
  uVar8 = 0;
  do {
    hydro_random_u32();
    auVar9 = vpbroadcastd_avx512vl();
    auVar9 = vpsrlvd_avx2(auVar9,_DAT_00108010);
    lVar7 = lVar7 + -1;
    auVar2._8_4_ = 1;
    auVar2._0_8_ = 0x100000001;
    auVar2._12_4_ = 1;
    auVar9 = vpandd_avx512vl(auVar9,auVar2);
    auVar10 = vpmovzxdq_avx2(auVar9);
    auVar10 = vpaddq_avx2(ZEXT832(uVar8),auVar10);
    auVar9 = vpaddq_avx(auVar10._0_16_,auVar10._16_16_);
    auVar2 = vpshufd_avx(auVar9,0xee);
    auVar9 = vpaddq_avx(auVar9,auVar2);
    uVar8 = auVar9._0_8_;
  } while (lVar7 != 0);
  if (0xf9e < uVar8 - 0x4651) {
    __assert_fail("b > 18000 && b < 22000",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x27,"void test_randombytes(void)");
  }
  hydro_random_buf(&local_2748,10000);
  auVar9[8] = 1;
  auVar9._0_8_ = 0x101010101010101;
  auVar9[9] = 1;
  auVar9[10] = 1;
  auVar9[0xb] = 1;
  auVar9[0xc] = 1;
  auVar9[0xd] = 1;
  auVar9[0xe] = 1;
  auVar9[0xf] = 1;
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  lVar7 = 0;
  do {
    puVar1 = local_2748.eph_kp.pk + lVar7;
    lVar7 = lVar7 + 8;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)puVar1;
    auVar2 = vpand_avx(auVar13,auVar9);
    auVar11 = vpmovzxbq_avx512f(auVar2);
    auVar12 = vpaddq_avx512f(auVar12,auVar11);
  } while (lVar7 != 10000);
  auVar10 = vextracti64x4_avx512f(auVar12,1);
  auVar12 = vpaddq_avx512f(auVar12,ZEXT3264(auVar10));
  auVar9 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
  auVar2 = vpshufd_avx(auVar9,0xee);
  auVar9 = vpaddq_avx(auVar9,auVar2);
  if (0x3e6 < auVar9._0_8_ - 0x1195U) {
    __assert_fail("b > 4500 && b < 5500",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x30,"void test_randombytes(void)");
  }
  local_2928[0] = local_2748.eph_kp.pk[0];
  local_2928[1] = local_2748.eph_kp.pk[1];
  local_2928._2_6_ =
       (undefined6)
       (CONCAT26(local_2748.eph_kp.pk._6_2_,
                 CONCAT24(local_2748.eph_kp.pk._4_2_,local_2748.eph_kp.pk._0_4_)) >> 0x10);
  local_2928[8] = local_2748.eph_kp.pk[8];
  local_2928[9] = local_2748.eph_kp.pk[9];
  local_2928[10] = local_2748.eph_kp.pk[10];
  local_2928[0xb] = local_2748.eph_kp.pk[0xb];
  local_2928[0xc] = local_2748.eph_kp.pk[0xc];
  local_2928[0xd] = local_2748.eph_kp.pk[0xd];
  local_2928[0xe] = local_2748.eph_kp.pk[0xe];
  local_2928[0xf] = local_2748.eph_kp.pk[0xf];
  local_2928[0x10] = local_2748.eph_kp.pk[0x10];
  local_2928[0x11] = local_2748.eph_kp.pk[0x11];
  local_2928[0x12] = local_2748.eph_kp.pk[0x12];
  local_2928[0x13] = local_2748.eph_kp.pk[0x13];
  local_2928[0x14] = local_2748.eph_kp.pk[0x14];
  local_2928[0x15] = local_2748.eph_kp.pk[0x15];
  local_2928[0x16] = local_2748.eph_kp.pk[0x16];
  local_2928[0x17] = local_2748.eph_kp.pk[0x17];
  local_2928[0x18] = local_2748.eph_kp.pk[0x18];
  local_2928[0x19] = local_2748.eph_kp.pk[0x19];
  local_2928[0x1a] = local_2748.eph_kp.pk[0x1a];
  local_2928[0x1b] = local_2748.eph_kp.pk[0x1b];
  local_2928[0x1c] = local_2748.eph_kp.pk[0x1c];
  local_2928[0x1d] = local_2748.eph_kp.pk[0x1d];
  local_2928[0x1e] = local_2748.eph_kp.pk[0x1e];
  local_2928[0x1f] = local_2748.eph_kp.pk[0x1f];
  hydro_random_buf_deterministic(&local_2748,10000,local_2928);
  auVar16[8] = 1;
  auVar16._0_8_ = 0x101010101010101;
  auVar16[9] = 1;
  auVar16[10] = 1;
  auVar16[0xb] = 1;
  auVar16[0xc] = 1;
  auVar16[0xd] = 1;
  auVar16[0xe] = 1;
  auVar16[0xf] = 1;
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  lVar7 = 0;
  do {
    puVar1 = local_2748.eph_kp.pk + lVar7;
    lVar7 = lVar7 + 8;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)puVar1;
    auVar9 = vpand_avx(auVar14,auVar16);
    auVar11 = vpmovzxbq_avx512f(auVar9);
    auVar12 = vpaddq_avx512f(auVar12,auVar11);
  } while (lVar7 != 10000);
  auVar10 = vextracti64x4_avx512f(auVar12,1);
  auVar12 = vpaddq_avx512f(auVar12,ZEXT3264(auVar10));
  auVar9 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
  auVar2 = vpshufd_avx(auVar9,0xee);
  auVar9 = vpaddq_avx(auVar9,auVar2);
  if (0x3e6 < auVar9._0_8_ - 0x1195U) {
    __assert_fail("b > 4500 && b < 5500",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x3a,"void test_randombytes(void)");
  }
  hydro_random_buf_deterministic(&local_2748,10000,local_2928);
  auVar17[8] = 1;
  auVar17._0_8_ = 0x101010101010101;
  auVar17[9] = 1;
  auVar17[10] = 1;
  auVar17[0xb] = 1;
  auVar17[0xc] = 1;
  auVar17[0xd] = 1;
  auVar17[0xe] = 1;
  auVar17[0xf] = 1;
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  lVar7 = 0;
  do {
    puVar1 = local_2748.eph_kp.pk + lVar7;
    lVar7 = lVar7 + 8;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)puVar1;
    auVar2 = vpand_avx(auVar15,auVar17);
    auVar11 = vpmovzxbq_avx512f(auVar2);
    auVar12 = vpaddq_avx512f(auVar12,auVar11);
  } while (lVar7 != 10000);
  auVar10 = vextracti64x4_avx512f(auVar12,1);
  auVar12 = vpaddq_avx512f(auVar12,ZEXT3264(auVar10));
  auVar2 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
  auVar13 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar13);
  if (auVar2._0_8_ != auVar9._0_8_) {
    __assert_fail("b == bp",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x43,"void test_randombytes(void)");
  }
  lVar7 = 0;
  do {
    uVar8 = 1;
    do {
      uVar5 = hydro_random_uniform((uint32_t)uVar8);
      if (uVar8 <= uVar5) {
        __assert_fail("x < j",
                      "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                      ,0x48,"void test_randombytes(void)");
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 100);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 1000);
  local_2998.pk[0] = '\0';
  local_2998.pk[1] = '\0';
  local_2998.pk[2] = '\0';
  local_2998.pk[3] = '\0';
  local_2998.pk[4] = '\0';
  local_2998.pk[5] = '\0';
  local_2998.pk[6] = '\0';
  local_2998.pk[7] = '\0';
  local_2998.pk[8] = '\0';
  local_2998.pk[9] = '\0';
  local_2998.pk[10] = '\0';
  local_2998.pk[0xb] = '\0';
  local_2998.pk[0xc] = '\0';
  local_2998.pk[0xd] = '\0';
  local_2998.pk[0xe] = '\0';
  local_2998.pk[0xf] = '\0';
  local_2998.pk[0x10] = '\0';
  local_2998.pk[0x11] = '\0';
  local_2998.pk[0x12] = '\0';
  local_2998.pk[0x13] = '\0';
  local_2998.pk[0x14] = '\0';
  local_2998.pk[0x15] = '\0';
  local_2998.pk[0x16] = '\0';
  local_2998.pk[0x17] = '\0';
  local_2998.pk[0x18] = '\0';
  local_2998.pk[0x19] = '\0';
  local_2998.pk[0x1a] = '\0';
  local_2998.pk[0x1b] = '\0';
  local_2998.pk[0x1c] = '\0';
  local_2998.pk[0x1d] = '\0';
  local_2998.pk[0x1e] = '\0';
  local_2998.pk[0x1f] = '\0';
  hydro_random_buf_deterministic((hydro_kx_keypair *)local_2a18,0x19,local_2998.pk);
  hydro_increment(local_2998.pk,0x20);
  hydro_random_buf_deterministic(local_2928,0x20,local_2998.pk);
  hydro_increment(local_2998.pk,0x20);
  hydro_secretbox_encrypt
            ((uint8_t *)&local_2748,(hydro_kx_keypair *)local_2a18,0x19,0,"libtests",local_2928);
  iVar4 = hydro_secretbox_decrypt(&local_2a58,(uint8_t *)&local_2748,0x3d,0,"libtests",local_2928);
  if (iVar4 != 0) {
    __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 0, ctx, key) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xc3,"void test_secretbox(void)");
  }
  _Var3 = hydro_equal((hydro_kx_keypair *)local_2a18,&local_2a58,0x19);
  if (!_Var3) {
    __assert_fail("hydro_equal(m, m2, sizeof m)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xc4,"void test_secretbox(void)");
  }
  hydro_secretbox_probe_create(local_29d8,(uint8_t *)&local_2748,0x3d,"libtests",local_2928);
  iVar4 = hydro_secretbox_probe_verify(local_29d8,(uint8_t *)&local_2748,0x3d,"libtests",local_2928)
  ;
  if (iVar4 != 0) {
    __assert_fail("hydro_secretbox_probe_verify(probe, c, sizeof c, ctx, key) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,199,"void test_secretbox(void)");
  }
  local_29d8[0] = local_29d8[0] + '\x01';
  iVar4 = hydro_secretbox_probe_verify(local_29d8,(uint8_t *)&local_2748,0x3d,"libtests",local_2928)
  ;
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_probe_verify(probe, c, sizeof c, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xc9,"void test_secretbox(void)");
  }
  local_29d8[0] = local_29d8[0] + 0xff;
  local_2928[0] = local_2928[0] + '\x01';
  iVar4 = hydro_secretbox_probe_verify(local_29d8,(uint8_t *)&local_2748,0x3d,"libtests",local_2928)
  ;
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_probe_verify(probe, c, sizeof c, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xcc,"void test_secretbox(void)");
  }
  local_2928[0] = local_2928[0] + 0xff;
  iVar4 = hydro_secretbox_decrypt(&local_2a58,(uint8_t *)&local_2748,0,0,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_decrypt(m2, c, 0, 0, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xcf,"void test_secretbox(void)");
  }
  iVar4 = hydro_secretbox_decrypt(&local_2a58,(uint8_t *)&local_2748,1,0,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_decrypt(m2, c, 1, 0, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xd0,"void test_secretbox(void)");
  }
  iVar4 = hydro_secretbox_decrypt(&local_2a58,(uint8_t *)&local_2748,0x24,0,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_decrypt(m2, c, hydro_secretbox_HEADERBYTES, 0, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xd1,"void test_secretbox(void)");
  }
  iVar4 = hydro_secretbox_decrypt(&local_2a58,(uint8_t *)&local_2748,0x3d,1,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 1, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xd2,"void test_secretbox(void)");
  }
  _Var3 = hydro_equal((hydro_kx_keypair *)local_2a18,&local_2a58,0x19);
  if (_Var3) {
    __assert_fail("!hydro_equal(m, m2, sizeof m)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xd3,"void test_secretbox(void)");
  }
  local_2928[0] = local_2928[0] + '\x01';
  iVar4 = hydro_secretbox_decrypt(&local_2a58,(uint8_t *)&local_2748,0x3d,0,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 0, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xd5,"void test_secretbox(void)");
  }
  local_2928[0] = local_2928[0] + 0xff;
  uVar5 = hydro_random_uniform(0x3d);
  puVar1 = local_2748.eph_kp.pk + uVar5;
  *puVar1 = *puVar1 + '\x01';
  iVar4 = hydro_secretbox_decrypt(&local_2a58,(uint8_t *)&local_2748,0x3d,0,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_secretbox_decrypt(m2, c, sizeof c, 0, ctx, key) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xd8,"void test_secretbox(void)");
  }
  hydro_random_buf(&local_2748,500);
  hydro_sign_keygen((hydro_sign_keypair *)local_2928);
  puVar1 = local_2928 + 0x20;
  hydro_sign_create(local_2998.pk,&local_2748,500,"libtests",puVar1);
  iVar4 = hydro_sign_verify(local_2998.pk,&local_2748,500,"libtests",(uint8_t *)local_2928);
  if (iVar4 != 0) {
    __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x10b,"void test_sign(void)");
  }
  local_2998.pk[0] = local_2998.pk[0] + '\x01';
  iVar4 = hydro_sign_verify(local_2998.pk,&local_2748,500,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x10d,"void test_sign(void)");
  }
  local_2998.pk[0] = local_2998.pk[0] + 0xff;
  local_2998.sk[0x1f] = local_2998.sk[0x1f] + '\x01';
  iVar4 = hydro_sign_verify(local_2998.pk,&local_2748,500,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x110,"void test_sign(void)");
  }
  local_2998.sk[0x1f] = local_2998.sk[0x1f] + 0xff;
  local_2748.eph_kp.pk[0] = local_2748.eph_kp.pk[0] + '\x01';
  iVar4 = hydro_sign_verify(local_2998.pk,&local_2748,500,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x113,"void test_sign(void)");
  }
  local_2748.eph_kp.pk[0] = local_2748.eph_kp.pk[0] + '\x01';
  hydro_sign_create(local_2998.pk,&local_2748,500,"libtests",puVar1);
  hydro_sign_init((hydro_sign_state *)local_2a18,"libtests");
  hydro_sign_update((hydro_sign_state *)local_2a18,&local_2748,0xa6);
  hydro_sign_update((hydro_sign_state *)local_2a18,local_26a2,0x14e);
  iVar4 = hydro_sign_final_verify((hydro_sign_state *)local_2a18,local_2998.pk,local_2928);
  if (iVar4 != 0) {
    __assert_fail("hydro_sign_final_verify(&st, sig, kp.pk) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x11a,"void test_sign(void)");
  }
  hydro_sign_init((hydro_sign_state *)local_2a18,"libtests");
  hydro_sign_update((hydro_sign_state *)local_2a18,&local_2748,0xa6);
  hydro_sign_update((hydro_sign_state *)local_2a18,local_26a2,0x14e);
  hydro_sign_final_create((hydro_sign_state *)local_2a18,local_2998.pk,puVar1);
  hydro_sign_init((hydro_sign_state *)local_2a18,"libtests");
  hydro_sign_update((hydro_sign_state *)local_2a18,&local_2748,0xa6);
  hydro_sign_update((hydro_sign_state *)local_2a18,local_26a2,0x14e);
  iVar4 = hydro_sign_final_verify((hydro_sign_state *)local_2a18,local_2998.pk,local_2928);
  if (iVar4 != 0) {
    __assert_fail("hydro_sign_final_verify(&st, sig, kp.pk) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x124,"void test_sign(void)");
  }
  hydro_sign_init((hydro_sign_state *)local_2a18,"libtests");
  hydro_sign_update((hydro_sign_state *)local_2a18,&local_2748,0xa6);
  hydro_sign_update((hydro_sign_state *)local_2a18,local_26a2,0x14e);
  local_2998.pk[0] = local_2998.pk[0] + '\x01';
  iVar4 = hydro_sign_final_verify((hydro_sign_state *)local_2a18,local_2998.pk,local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_sign_final_verify(&st, sig, kp.pk) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x12a,"void test_sign(void)");
  }
  hydro_sign_create(local_2998.pk,&local_2748,0,"libtests",puVar1);
  iVar4 = hydro_sign_verify(local_2998.pk,&local_2748,500,"libtests",local_2928);
  if (iVar4 != -1) {
    __assert_fail("hydro_sign_verify(sig, msg, sizeof msg, ctx, kp.pk) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x12d,"void test_sign(void)");
  }
  iVar4 = hydro_sign_verify(local_2998.pk,&local_2748,0,"libtests",local_2928);
  if (iVar4 != 0) {
    __assert_fail("hydro_sign_verify(sig, msg, 0, ctx, kp.pk) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x12e,"void test_sign(void)");
  }
  return 0;
}

Assistant:

int
main(void)
{
#ifdef _MSC_VER
    /*
     * On Windows, disable the "Abort - Retry - Ignore" GUI dialog that otherwise pops up on
     * assertion failure.
     */
    _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif

    int ret;

    ret = hydro_init();
    assert(ret == 0);

    test_core();
    test_hash();
    test_kdf();
    test_kx_n();
    test_kx_kk();
    test_kx_xx();
    test_kx_nk();
    test_pwhash();
    test_randombytes();
    test_secretbox();
    test_sign();

    return 0;
}